

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::anon_unknown_0::createSubpassPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkRenderPass renderPass,VkShaderModule vertexShaderModule,
          VkShaderModule fragmentShaderModule,VkPipelineLayout pipelineLayout,
          SubpassRenderInfo *renderInfo)

{
  bool bVar1;
  deUint32 dVar2;
  uint uVar3;
  Maybe<vkt::(anonymous_namespace)::Attachment> *pMVar4;
  Attachment *this;
  UVec2 *pUVar5;
  VkSampleCountFlagBits *pVVar6;
  size_type sVar7;
  reference local_428;
  VkPipelineCache local_3c8;
  undefined1 local_3c0 [8];
  VkGraphicsPipelineCreateInfo createInfo;
  VkPipelineColorBlendStateCreateInfo blendState;
  VkPipelineDepthStencilStateCreateInfo depthStencilState;
  size_t stencilIndex;
  VkPipelineMultisampleStateCreateInfo multisampleState;
  VkPipelineRasterizationStateCreateInfo rasterState;
  undefined1 local_210 [8];
  VkPipelineViewportStateCreateInfo viewportState;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyState;
  VkPipelineVertexInputStateCreateInfo vertexInputState;
  VkVertexInputAttributeDescription vertexAttrib;
  VkVertexInputBindingDescription vertexBinding;
  VkPipelineShaderStageCreateInfo shaderStages [2];
  Attachment *attachment_1;
  VkPipelineColorBlendAttachmentState attachmentBlendState;
  VkSampleCountFlagBits local_9c;
  Attachment *local_98;
  Attachment *attachment;
  undefined1 local_88 [4];
  deUint32 attachmentNdx;
  vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  attachmentBlendStates;
  Maybe<vk::VkSampleCountFlagBits> rasterSamples;
  VkSpecializationInfo emptyShaderSpecializations;
  VkDevice device_local;
  DeviceInterface *vk_local;
  VkPipelineLayout pipelineLayout_local;
  VkShaderModule fragmentShaderModule_local;
  VkShaderModule vertexShaderModule_local;
  VkRenderPass renderPass_local;
  
  memset(&rasterSamples.field_1,0,0x20);
  tcu::Maybe<vk::VkSampleCountFlagBits>::Maybe
            ((Maybe<vk::VkSampleCountFlagBits> *)
             &attachmentBlendStates.
              super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::vector((vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
            *)local_88);
  for (attachment._4_4_ = 0; uVar3 = attachment._4_4_,
      dVar2 = SubpassRenderInfo::getColorAttachmentCount(renderInfo), uVar3 < dVar2;
      attachment._4_4_ = attachment._4_4_ + 1) {
    local_98 = SubpassRenderInfo::getColorAttachment(renderInfo,attachment._4_4_);
    local_9c = Attachment::getSamples(local_98);
    tcu::Maybe<vk::VkSampleCountFlagBits>::operator=
              ((Maybe<vk::VkSampleCountFlagBits> *)
               &attachmentBlendStates.
                super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_9c);
    attachmentBlendState.dstColorBlendFactor = VK_BLEND_FACTOR_ONE;
    attachmentBlendState.colorBlendOp = VK_BLEND_OP_SUBTRACT;
    attachmentBlendState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
    attachmentBlendState.dstAlphaBlendFactor = VK_BLEND_FACTOR_SRC1_COLOR;
    attachment_1 = (Attachment *)0x600000000;
    attachmentBlendState.blendEnable = 7;
    attachmentBlendState.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
    std::
    vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
    ::push_back((vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                 *)local_88,(value_type *)&attachment_1);
  }
  pMVar4 = SubpassRenderInfo::getDepthStencilAttachment(renderInfo);
  bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)pMVar4);
  if (bVar1) {
    pMVar4 = SubpassRenderInfo::getDepthStencilAttachment(renderInfo);
    this = tcu::Maybe<vkt::(anonymous_namespace)::Attachment>::operator*(pMVar4);
    shaderStages[1].pSpecializationInfo._4_4_ = Attachment::getSamples(this);
    tcu::Maybe<vk::VkSampleCountFlagBits>::operator=
              ((Maybe<vk::VkSampleCountFlagBits> *)
               &attachmentBlendStates.
                super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (VkSampleCountFlagBits *)((long)&shaderStages[1].pSpecializationInfo + 4));
  }
  bVar1 = tcu::Maybe::operator_cast_to_bool
                    ((Maybe *)&attachmentBlendStates.
                               super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (!bVar1) {
    shaderStages[1].pSpecializationInfo._0_4_ = 1;
    tcu::Maybe<vk::VkSampleCountFlagBits>::operator=
              ((Maybe<vk::VkSampleCountFlagBits> *)
               &attachmentBlendStates.
                super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (VkSampleCountFlagBits *)&shaderStages[1].pSpecializationInfo);
  }
  vertexBinding.inputRate = 0x12;
  shaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[0]._4_4_ = 0;
  shaderStages[0].pNext._0_4_ = 0;
  shaderStages[0].pNext._4_4_ = 1;
  shaderStages[0].module.m_internal = (long)"pre_main" + 4;
  shaderStages[0].pName = (char *)&rasterSamples.field_1;
  shaderStages[0].pSpecializationInfo._0_4_ = 0x12;
  shaderStages[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderStages[1]._4_4_ = 0;
  shaderStages[1].pNext._0_4_ = 0;
  shaderStages[1].pNext._4_4_ = 0x10;
  shaderStages[1].module.m_internal = (long)"pre_main" + 4;
  vertexAttrib.format = VK_FORMAT_UNDEFINED;
  vertexAttrib.offset = 8;
  vertexBinding.binding = 0;
  vertexInputState.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  vertexAttrib.location = 0x67;
  vertexAttrib.binding = 0;
  inputAssemblyState.primitiveRestartEnable = 0x13;
  vertexInputState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputState._4_4_ = 0;
  vertexInputState.pNext._0_4_ = 0;
  vertexInputState.pNext._4_4_ = 1;
  vertexInputState._16_8_ = &vertexAttrib.format;
  vertexInputState.pVertexBindingDescriptions._0_4_ = 1;
  vertexInputState._32_8_ = &vertexInputState.pVertexAttributeDescriptions;
  inputAssemblyState.pNext = (void *)0x300000000;
  inputAssemblyState.flags = 0;
  inputAssemblyState.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  viewport.minDepth = 2.8026e-44;
  viewport.maxDepth = 0.0;
  inputAssemblyState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputAssemblyState._4_4_ = 0;
  shaderStages[0]._16_8_ = vertexShaderModule.m_internal;
  shaderStages[1]._16_8_ = fragmentShaderModule.m_internal;
  shaderStages[1].pName = shaderStages[0].pName;
  pUVar5 = SubpassRenderInfo::getViewportOffset(renderInfo);
  uVar3 = tcu::Vector<unsigned_int,_2>::x(pUVar5);
  scissor.extent.width = (deUint32)(float)uVar3;
  pUVar5 = SubpassRenderInfo::getViewportOffset(renderInfo);
  uVar3 = tcu::Vector<unsigned_int,_2>::y(pUVar5);
  scissor.extent.height = (deUint32)(float)uVar3;
  pUVar5 = SubpassRenderInfo::getViewportSize(renderInfo);
  uVar3 = tcu::Vector<unsigned_int,_2>::x(pUVar5);
  viewport.x = (float)uVar3;
  pUVar5 = SubpassRenderInfo::getViewportSize(renderInfo);
  uVar3 = tcu::Vector<unsigned_int,_2>::y(pUVar5);
  viewport.y = (float)uVar3;
  viewport.width = 0.0;
  viewport.height = 1.0;
  pUVar5 = SubpassRenderInfo::getViewportOffset(renderInfo);
  viewportState.pScissors._0_4_ = tcu::Vector<unsigned_int,_2>::x(pUVar5);
  pUVar5 = SubpassRenderInfo::getViewportOffset(renderInfo);
  viewportState.pScissors._4_4_ = tcu::Vector<unsigned_int,_2>::y(pUVar5);
  pUVar5 = SubpassRenderInfo::getViewportSize(renderInfo);
  scissor.offset.x = tcu::Vector<unsigned_int,_2>::x(pUVar5);
  pUVar5 = SubpassRenderInfo::getViewportSize(renderInfo);
  scissor.offset.y = tcu::Vector<unsigned_int,_2>::y(pUVar5);
  local_210._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  viewportState._4_4_ = 0;
  viewportState.pNext._0_4_ = 0;
  viewportState.pNext._4_4_ = 1;
  viewportState._16_8_ = &scissor.extent;
  viewportState.pViewports._0_4_ = 1;
  viewportState._32_8_ = &viewportState.pScissors;
  multisampleState.alphaToCoverageEnable = 0x17;
  multisampleState.alphaToOneEnable = 0;
  multisampleState.sampleShadingEnable = 0;
  multisampleState.minSampleShading = 0.0;
  multisampleState.pSampleMask = (VkSampleMask *)0x0;
  multisampleState.pNext = (void *)0x0;
  multisampleState.flags = 0;
  multisampleState.rasterizationSamples = 0;
  multisampleState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  multisampleState._4_4_ = 0;
  stencilIndex = 0x18;
  pVVar6 = tcu::Maybe<vk::VkSampleCountFlagBits>::operator*
                     ((Maybe<vk::VkSampleCountFlagBits> *)
                      &attachmentBlendStates.
                       super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  multisampleState.pNext._4_4_ = *pVVar6;
  SubpassRenderInfo::getSubpassIndex(renderInfo);
  blendState.blendConstants[2] = 3.50325e-44;
  createInfo.basePipelineIndex = 0x1a;
  blendState.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  blendState._4_4_ = 0;
  blendState.pNext._0_4_ = 0;
  blendState.pNext._4_4_ = 0;
  blendState.flags = 3;
  sVar7 = std::
          vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
          ::size((vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                  *)local_88);
  blendState.logicOpEnable = (VkBool32)sVar7;
  bVar1 = std::
          vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
          ::empty((vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                   *)local_88);
  if (bVar1) {
    local_428 = (reference)0x0;
  }
  else {
    local_428 = std::
                vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                ::operator[]((vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
                              *)local_88,0);
  }
  blendState._24_8_ = local_428;
  blendState.pAttachments._0_4_ = 0;
  blendState.pAttachments._4_4_ = 0;
  blendState.blendConstants[0] = 0.0;
  blendState.blendConstants[1] = 0.0;
  local_3c0._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  createInfo._4_4_ = 0;
  createInfo.pNext._0_4_ = 0;
  createInfo.pNext._4_4_ = 2;
  createInfo._16_8_ = &vertexBinding.inputRate;
  createInfo.pStages = (VkPipelineShaderStageCreateInfo *)&inputAssemblyState.primitiveRestartEnable
  ;
  createInfo.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)&viewport.minDepth;
  createInfo.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  createInfo.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_210;
  createInfo.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&multisampleState.alphaToCoverageEnable;
  createInfo.pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)&stencilIndex;
  createInfo.pMultisampleState =
       (VkPipelineMultisampleStateCreateInfo *)(blendState.blendConstants + 2);
  createInfo.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)&createInfo.basePipelineIndex;
  createInfo.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  createInfo.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pipelineLayout.m_internal;
  createInfo.layout.m_internal = renderPass.m_internal;
  createInfo.renderPass.m_internal._0_4_ = SubpassRenderInfo::getSubpassIndex(renderInfo);
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&createInfo.subpass,0);
  createInfo.basePipelineHandle.m_internal._0_4_ = 0;
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_3c8,0);
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device,local_3c8,(VkGraphicsPipelineCreateInfo *)local_3c0,
             (VkAllocationCallbacks *)0x0);
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ::~vector((vector<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
             *)local_88);
  tcu::Maybe<vk::VkSampleCountFlagBits>::~Maybe
            ((Maybe<vk::VkSampleCountFlagBits> *)
             &attachmentBlendStates.
              super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Move<VkPipeline> createSubpassPipeline (const DeviceInterface&		vk,
										VkDevice					device,
										VkRenderPass				renderPass,
										VkShaderModule				vertexShaderModule,
										VkShaderModule				fragmentShaderModule,
										VkPipelineLayout			pipelineLayout,
										const SubpassRenderInfo&	renderInfo)
{
	const VkSpecializationInfo emptyShaderSpecializations =
	{
		0u,			// mapEntryCount
		DE_NULL,	// pMap
		0u,			// dataSize
		DE_NULL,	// pData
	};

	Maybe<VkSampleCountFlagBits>				rasterSamples;
	vector<VkPipelineColorBlendAttachmentState>	attachmentBlendStates;

	for (deUint32 attachmentNdx = 0; attachmentNdx < renderInfo.getColorAttachmentCount(); attachmentNdx++)
	{
		const Attachment&	attachment	= renderInfo.getColorAttachment(attachmentNdx);

		DE_ASSERT(!rasterSamples || *rasterSamples == attachment.getSamples());

		rasterSamples = attachment.getSamples();

		{
			const VkPipelineColorBlendAttachmentState	attachmentBlendState =
			{
				VK_FALSE,																								// blendEnable
				VK_BLEND_FACTOR_SRC_ALPHA,																				// srcBlendColor
				VK_BLEND_FACTOR_ONE_MINUS_SRC_ALPHA,																	// destBlendColor
				VK_BLEND_OP_ADD,																						// blendOpColor
				VK_BLEND_FACTOR_ONE,																					// srcBlendAlpha
				VK_BLEND_FACTOR_ONE,																					// destBlendAlpha
				VK_BLEND_OP_ADD,																						// blendOpAlpha
				VK_COLOR_COMPONENT_R_BIT|VK_COLOR_COMPONENT_G_BIT|VK_COLOR_COMPONENT_B_BIT|VK_COLOR_COMPONENT_A_BIT,	// channelWriteMask
			};

			attachmentBlendStates.push_back(attachmentBlendState);
		}
	}

	if (renderInfo.getDepthStencilAttachment())
	{
		const Attachment& attachment = *renderInfo.getDepthStencilAttachment();

		DE_ASSERT(!rasterSamples || *rasterSamples == attachment.getSamples());
		rasterSamples = attachment.getSamples();
	}

	// If there are no attachment use single sample
	if (!rasterSamples)
		rasterSamples = VK_SAMPLE_COUNT_1_BIT;

	const VkPipelineShaderStageCreateInfo shaderStages[2] =
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			(VkPipelineShaderStageCreateFlags)0u,
			VK_SHADER_STAGE_VERTEX_BIT,								// stage
			vertexShaderModule,										// shader
			"main",
			&emptyShaderSpecializations
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			(VkPipelineShaderStageCreateFlags)0u,
			VK_SHADER_STAGE_FRAGMENT_BIT,							// stage
			fragmentShaderModule,									// shader
			"main",
			&emptyShaderSpecializations
		}
	};
	const VkVertexInputBindingDescription vertexBinding =
	{
		0u,															// binding
		(deUint32)sizeof(tcu::Vec2),								// strideInBytes
		VK_VERTEX_INPUT_RATE_VERTEX,								// stepRate
	};
	const VkVertexInputAttributeDescription vertexAttrib =
	{
		0u,															// location
		0u,															// binding
		VK_FORMAT_R32G32_SFLOAT,									// format
		0u,															// offsetInBytes
	};
	const VkPipelineVertexInputStateCreateInfo vertexInputState =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	//	sType
		DE_NULL,													//	pNext
		(VkPipelineVertexInputStateCreateFlags)0u,
		1u,															//	bindingCount
		&vertexBinding,												//	pVertexBindingDescriptions
		1u,															//	attributeCount
		&vertexAttrib,												//	pVertexAttributeDescriptions
	};
	const VkPipelineInputAssemblyStateCreateInfo inputAssemblyState =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// sType
		DE_NULL,														// pNext
		(VkPipelineInputAssemblyStateCreateFlags)0u,
		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,							// topology
		VK_FALSE,														// primitiveRestartEnable
	};
	const VkViewport viewport =
	{
		(float)renderInfo.getViewportOffset().x(),	(float)renderInfo.getViewportOffset().y(),
		(float)renderInfo.getViewportSize().x(),	(float)renderInfo.getViewportSize().y(),
		0.0f, 1.0f
	};
	const VkRect2D scissor =
	{
		{ (deInt32)renderInfo.getViewportOffset().x(),	(deInt32)renderInfo.getViewportOffset().y() },
		{ renderInfo.getViewportSize().x(),				renderInfo.getViewportSize().y() }
	};
	const VkPipelineViewportStateCreateInfo viewportState =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,
		DE_NULL,
		(VkPipelineViewportStateCreateFlags)0u,
		1u,
		&viewport,
		1u,
		&scissor
	};
	const VkPipelineRasterizationStateCreateInfo rasterState =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// sType
		DE_NULL,														// pNext
		(VkPipelineRasterizationStateCreateFlags)0u,
		VK_TRUE,														// depthClipEnable
		VK_FALSE,														// rasterizerDiscardEnable
		VK_POLYGON_MODE_FILL,											// fillMode
		VK_CULL_MODE_NONE,												// cullMode
		VK_FRONT_FACE_COUNTER_CLOCKWISE,								// frontFace
		VK_FALSE,														// depthBiasEnable
		0.0f,															// depthBias
		0.0f,															// depthBiasClamp
		0.0f,															// slopeScaledDepthBias
		1.0f															// lineWidth
	};
	const VkPipelineMultisampleStateCreateInfo multisampleState =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,		// sType
		DE_NULL,														// pNext
		(VkPipelineMultisampleStateCreateFlags)0u,
		*rasterSamples,													// rasterSamples
		VK_FALSE,														// sampleShadingEnable
		0.0f,															// minSampleShading
		DE_NULL,														// pSampleMask
		VK_FALSE,														// alphaToCoverageEnable
		VK_FALSE,														// alphaToOneEnable
	};
	const size_t stencilIndex = renderInfo.getSubpassIndex();
	const VkPipelineDepthStencilStateCreateInfo depthStencilState =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		(VkPipelineDepthStencilStateCreateFlags)0u,
		VK_TRUE,													// depthTestEnable
		VK_TRUE,													// depthWriteEnable
		VK_COMPARE_OP_ALWAYS,										// depthCompareOp
		VK_FALSE,													// depthBoundsEnable
		VK_TRUE,													// stencilTestEnable
		{
			VK_STENCIL_OP_REPLACE,									// stencilFailOp
			VK_STENCIL_OP_REPLACE,									// stencilPassOp
			VK_STENCIL_OP_REPLACE,									// stencilDepthFailOp
			VK_COMPARE_OP_ALWAYS,									// stencilCompareOp
			~0u,													// stencilCompareMask
			~0u,													// stencilWriteMask
			((stencilIndex % 2) == 0) ? ~0x0u : 0x0u				// stencilReference
		},															// front
		{
			VK_STENCIL_OP_REPLACE,									// stencilFailOp
			VK_STENCIL_OP_REPLACE,									// stencilPassOp
			VK_STENCIL_OP_REPLACE,									// stencilDepthFailOp
			VK_COMPARE_OP_ALWAYS,									// stencilCompareOp
			~0u,													// stencilCompareMask
			~0u,													// stencilWriteMask
			((stencilIndex % 2) == 0) ? ~0x0u : 0x0u				// stencilReference
		},															// back

		0.0f,														// minDepthBounds;
		1.0f														// maxDepthBounds;
	};
	const VkPipelineColorBlendStateCreateInfo blendState =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,			// sType
		DE_NULL,															// pNext
		(VkPipelineColorBlendStateCreateFlags)0u,
		VK_FALSE,															// logicOpEnable
		VK_LOGIC_OP_COPY,													// logicOp
		(deUint32)attachmentBlendStates.size(),								// attachmentCount
		attachmentBlendStates.empty() ? DE_NULL : &attachmentBlendStates[0],// pAttachments
		{ 0.0f, 0.0f, 0.0f, 0.0f }											// blendConst
	};
	const VkGraphicsPipelineCreateInfo createInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,	// sType
		DE_NULL,											// pNext
		(VkPipelineCreateFlags)0u,

		2,													// stageCount
		shaderStages,										// pStages

		&vertexInputState,									// pVertexInputState
		&inputAssemblyState,								// pInputAssemblyState
		DE_NULL,											// pTessellationState
		&viewportState,										// pViewportState
		&rasterState,										// pRasterState
		&multisampleState,									// pMultisampleState
		&depthStencilState,									// pDepthStencilState
		&blendState,										// pColorBlendState
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,	// pDynamicState
		pipelineLayout,										// layout

		renderPass,											// renderPass
		renderInfo.getSubpassIndex(),						// subpass
		DE_NULL,											// basePipelineHandle
		0u													// basePipelineIndex
	};

	return createGraphicsPipeline(vk, device, DE_NULL, &createInfo);
}